

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O3

void yy_pop_parser_stack(yyParser_conflict *pParser)

{
  int iVar1;
  
  iVar1 = pParser->yyidx;
  if ((long)iVar1 < 0) {
    __assert_fail("pParser->yyidx>=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O3/src/zcc-parse.c"
                  ,0x626,"void yy_pop_parser_stack(yyParser *)");
  }
  pParser->yyidx = iVar1 + -1;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sPopping %s\n",yyTracePrompt,
            yyTokenName[pParser->yystack[iVar1].major]);
    return;
  }
  return;
}

Assistant:

static void yy_pop_parser_stack(yyParser *pParser){
  yyStackEntry *yytos;
  assert( pParser->yyidx>=0 );
  yytos = &pParser->yystack[pParser->yyidx--];
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sPopping %s\n",
      yyTracePrompt,
      yyTokenName[yytos->major]);
  }
#endif
  yy_destructor(pParser, yytos->major, &yytos->minor);
}